

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  int *piVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  BrotliEncoderDictionary *pBVar13;
  ulong uVar14;
  uint64_t uVar15;
  HasherCommon *pHVar16;
  BrotliDictionary *pBVar17;
  undefined8 uVar18;
  int iVar19;
  bool bVar20;
  ulong uVar21;
  size_t sVar22;
  int iVar23;
  uint32_t uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  size_t sVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint8_t *puVar37;
  ulong *puVar38;
  ulong uVar39;
  uint uVar40;
  uint16_t *num;
  ulong uVar41;
  ulong *puVar42;
  bool bVar43;
  ulong uVar44;
  uint16_t uVar45;
  int iVar46;
  long lVar47;
  uint8_t *puVar48;
  ulong uVar49;
  uint uVar50;
  long lVar51;
  ulong uVar52;
  uint8_t *s1_orig_1;
  uint8_t *puVar53;
  uint8_t *puVar54;
  long lVar55;
  ulong uVar56;
  int *piVar57;
  int last_distance;
  ulong uVar58;
  ulong uVar59;
  uint32_t *buckets;
  ulong uVar60;
  ulong uVar61;
  ulong *puVar62;
  ulong uVar63;
  uint16_t *num_3;
  uint32_t *buckets_3;
  ulong local_190;
  ulong local_178;
  ulong local_170;
  ulong local_158;
  int local_13c;
  size_t local_138;
  ulong local_130;
  uint local_f4;
  Command *local_f0;
  ulong local_d8;
  ulong local_c0;
  ulong local_88;
  ulong local_80;
  uint8_t *s1_orig_5;
  
  iVar27 = params->lgwin;
  uVar5 = (position - 7) + num_bytes;
  sVar33 = position;
  if (7 < num_bytes) {
    sVar33 = uVar5;
  }
  sVar9 = params->stream_offset;
  lVar34 = 0x200;
  if (params->quality < 9) {
    lVar34 = 0x40;
  }
  local_138 = *last_insert_len;
  uVar2 = position + num_bytes;
  sVar10 = (params->dictionary).compound.total_size;
  uVar26 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar26) {
    iVar46 = *dist_cache;
    dist_cache[4] = iVar46 + -1;
    dist_cache[5] = iVar46 + 1;
    dist_cache[6] = iVar46 + -2;
    dist_cache[7] = iVar46 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar46 + 3,iVar46 + -3);
    if (10 < uVar26) {
      iVar46 = dist_cache[1];
      dist_cache[10] = iVar46 + -1;
      dist_cache[0xb] = iVar46 + 1;
      dist_cache[0xc] = iVar46 + -2;
      dist_cache[0xd] = iVar46 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar46 + 3,iVar46 + -3);
    }
  }
  if (position + 8 < uVar2) {
    uVar6 = (1L << ((byte)iVar27 & 0x3f)) - 0x10;
    uVar31 = lVar34 + position;
    puVar11 = (hasher->privat)._H5.buckets_;
    puVar12 = (hasher->privat)._H6.buckets_;
    lVar28 = sVar10 + 1;
    lVar4 = position - 1;
    local_f0 = commands;
    uVar49 = position;
    do {
      uVar60 = uVar6;
      if (uVar49 < uVar6) {
        uVar60 = uVar49;
      }
      uVar61 = sVar9 + uVar49;
      if (uVar6 <= sVar9 + uVar49) {
        uVar61 = uVar6;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_f4 = 0;
        local_80 = 0;
      }
      else {
        if (uVar49 == 0) {
          local_80 = 0;
LAB_0030e482:
          uVar35 = 0;
        }
        else {
          local_80 = (ulong)ringbuffer[uVar49 - 1 & ringbuffer_mask];
          if (uVar49 == 1) goto LAB_0030e482;
          uVar35 = (ulong)ringbuffer[uVar49 - 2 & ringbuffer_mask];
        }
        local_f4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar35 + 0x100] | literal_context_lut[local_80]];
      }
      uVar35 = uVar2 - uVar49;
      pBVar13 = (params->dictionary).contextual.dict[local_f4];
      uVar14 = (params->dist).max_distance;
      uVar41 = uVar49 & ringbuffer_mask;
      uVar56 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar56 != 0) {
        puVar54 = ringbuffer + uVar41;
        local_158 = 0x7e4;
        uVar59 = 0;
        uVar58 = 0;
        local_178 = 0;
        local_88 = 0;
LAB_0030e521:
        uVar29 = (ulong)dist_cache[uVar58];
        if (((uVar29 <= uVar60) && (uVar49 - uVar29 < uVar49)) &&
           (uVar59 + uVar41 <= ringbuffer_mask)) {
          uVar36 = uVar49 - uVar29 & ringbuffer_mask;
          uVar52 = uVar36 + uVar59;
          if ((ringbuffer_mask < uVar52) || (ringbuffer[uVar59 + uVar41] != ringbuffer[uVar52]))
          goto LAB_0030e674;
          puVar37 = ringbuffer + uVar36;
          puVar48 = puVar37;
          uVar52 = uVar35;
          puVar53 = puVar54;
          if (7 < uVar35) {
            lVar47 = 0;
            lVar51 = 0;
LAB_0030e590:
            if (*(ulong *)(puVar54 + lVar47) == *(ulong *)(puVar37 + lVar47)) goto code_r0x0030e59d;
            uVar36 = *(ulong *)(puVar37 + lVar47) ^ *(ulong *)(puVar54 + lVar47);
            uVar52 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            uVar52 = (uVar52 >> 3 & 0x1fffffff) - lVar51;
            goto LAB_0030e617;
          }
          goto LAB_0030e5ce;
        }
        goto LAB_0030e674;
      }
      local_158 = 0x7e4;
      local_88 = 0;
      local_178 = 0;
      uVar59 = 0;
LAB_0030e69b:
      puVar3 = (ulong *)(ringbuffer + uVar41);
      uVar56 = (hasher->privat)._H5.block_size_;
      uVar15 = (hasher->privat)._H6.hash_mul_;
      uVar52 = *(long *)(ringbuffer + uVar41) * uVar15 >> 0x31;
      lVar47 = uVar52 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar7 = *(ushort *)((long)puVar11 + uVar52 * 2);
      uVar29 = (ulong)uVar7;
      uVar58 = 0;
      if (uVar56 <= uVar29) {
        uVar58 = uVar29 - uVar56;
      }
      uVar26 = (hasher->privat)._H6.block_mask_;
      if (uVar58 < uVar29) {
        uVar36 = uVar35 - 4;
        piVar1 = (int *)((long)puVar3 + 4);
LAB_0030e735:
        uVar29 = uVar29 - 1;
        uVar30 = uVar49 - puVar12[lVar47 + (ulong)((uint)uVar29 & uVar26)];
        if (uVar30 <= uVar60) {
          if (uVar59 + uVar41 <= ringbuffer_mask) {
            uVar63 = (ulong)(puVar12[lVar47 + (ulong)((uint)uVar29 & uVar26)] &
                            (uint)ringbuffer_mask);
            if (((ringbuffer_mask < uVar63 + uVar59) ||
                (ringbuffer[uVar59 + uVar41] != ringbuffer[uVar63 + uVar59])) ||
               (*(int *)(ringbuffer + uVar63) != (int)*(long *)(ringbuffer + uVar41)))
            goto LAB_0030e866;
            puVar48 = ringbuffer + uVar63 + 4;
            puVar54 = puVar48;
            piVar57 = piVar1;
            uVar63 = uVar36;
            if (7 < uVar36) {
              lVar51 = 0;
LAB_0030e7b4:
              if (*(ulong *)((long)piVar1 + lVar51) == *(ulong *)(puVar48 + lVar51))
              goto code_r0x0030e7c6;
              uVar44 = *(ulong *)(puVar48 + lVar51) ^ *(ulong *)((long)piVar1 + lVar51);
              uVar63 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
                }
              }
              lVar51 = (uVar63 >> 3 & 0x1fffffff) + lVar51;
              goto LAB_0030e835;
            }
            goto LAB_0030e7e2;
          }
          goto LAB_0030e866;
        }
      }
LAB_0030e87b:
      puVar12[lVar47 + (ulong)(uVar26 & uVar7)] = (uint32_t)uVar49;
      *(ushort *)((long)puVar11 + uVar52 * 2) = uVar7 + 1;
      if (local_158 == 0x7e4) {
        pHVar16 = (hasher->privat)._H6.common_;
        uVar60 = pHVar16->dict_num_lookups;
        local_130 = pHVar16->dict_num_matches;
        if (uVar60 >> 7 <= local_130) {
          uVar41 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar54 = pBVar13->hash_table_lengths;
          local_158 = 0x7e4;
          local_13c = 0;
          bVar43 = true;
LAB_0030e919:
          uVar60 = uVar60 + 1;
          pHVar16->dict_num_lookups = uVar60;
          bVar32 = puVar54[uVar41];
          uVar59 = (ulong)bVar32;
          if ((uVar59 != 0) && (uVar59 <= uVar35)) {
            pBVar17 = pBVar13->words;
            puVar38 = (ulong *)(pBVar17->data +
                               (ulong)pBVar17->offsets_by_length[uVar59] +
                               pBVar13->hash_table_words[uVar41] * uVar59);
            puVar62 = puVar3;
            uVar58 = uVar59;
            if (7 < bVar32) {
              lVar47 = 0;
              puVar42 = puVar3;
LAB_0030e989:
              if (*puVar38 == *puVar42) goto code_r0x0030e994;
              uVar29 = *puVar42 ^ *puVar38;
              uVar58 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                }
              }
              uVar58 = (uVar58 >> 3 & 0x1fffffff) - lVar47;
              goto LAB_0030e9f2;
            }
            goto LAB_0030e9bd;
          }
          goto LAB_0030e93a;
        }
LAB_0030f27d:
        local_138 = local_138 + 1;
        position = uVar49 + 1;
        if (uVar31 < position) {
          if ((uint)((int)lVar34 * 4) + uVar31 < position) {
            uVar60 = uVar49 + 0x11;
            if (uVar5 <= uVar49 + 0x11) {
              uVar60 = uVar5;
            }
            if (position < uVar60) {
              uVar26 = (hasher->privat)._H6.block_mask_;
              uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar49 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar15 >> 0x31;
                uVar7 = *(ushort *)((long)puVar11 + uVar49 * 2);
                *(ushort *)((long)puVar11 + uVar49 * 2) = uVar7 + 1;
                puVar12[(uVar49 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar26 & uVar7)] =
                     (uint32_t)position;
                local_138 = local_138 + 4;
                position = position + 4;
              } while (position < uVar60);
            }
          }
          else {
            uVar60 = uVar49 + 9;
            if (uVar5 <= uVar49 + 9) {
              uVar60 = uVar5;
            }
            if (position < uVar60) {
              uVar26 = (hasher->privat)._H6.block_mask_;
              uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar49 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar15 >> 0x31;
                uVar7 = *(ushort *)((long)puVar11 + uVar49 * 2);
                *(ushort *)((long)puVar11 + uVar49 * 2) = uVar7 + 1;
                puVar12[(uVar49 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar26 & uVar7)] =
                     (uint32_t)position;
                local_138 = local_138 + 2;
                position = position + 2;
              } while (position < uVar60);
            }
          }
        }
      }
      else {
        local_13c = 0;
LAB_0030eae8:
        if (local_158 < 0x7e5) goto LAB_0030f27d;
        iVar27 = (hasher->privat)._H6.num_last_distances_to_check_;
        uVar26 = (hasher->privat)._H6.block_mask_;
        uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        uVar31 = local_138 + 4;
        local_130 = (lVar4 + num_bytes) - uVar49;
        iVar46 = 0;
        do {
          uVar60 = uVar35 - 1;
          uVar61 = local_178 - 1;
          if (uVar60 <= local_178 - 1) {
            uVar61 = uVar60;
          }
          if (4 < params->quality) {
            uVar61 = 0;
          }
          uVar41 = uVar49 + 1;
          uVar59 = uVar6;
          if (uVar41 < uVar6) {
            uVar59 = uVar41;
          }
          local_c0 = sVar9 + uVar49 + 1;
          if (uVar6 <= local_c0) {
            local_c0 = uVar6;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_f4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_80 + 0x100] |
                              literal_context_lut[ringbuffer[uVar49 & ringbuffer_mask]]];
            local_80 = (ulong)ringbuffer[uVar49 & ringbuffer_mask];
          }
          uVar58 = uVar41 & ringbuffer_mask;
          pBVar13 = (params->dictionary).contextual.dict[local_f4];
          if (iVar27 != 0) {
            puVar54 = ringbuffer + uVar58;
            local_170 = 0x7e4;
            uVar52 = 0;
            local_190 = 0;
            uVar29 = 0;
LAB_0030ec4b:
            uVar36 = (ulong)dist_cache[uVar52];
            if (((uVar36 <= uVar59) && (uVar41 - uVar36 < uVar41)) &&
               (uVar61 + uVar58 <= ringbuffer_mask)) {
              uVar63 = uVar41 - uVar36 & ringbuffer_mask;
              uVar30 = uVar63 + uVar61;
              if ((ringbuffer_mask < uVar30) || (ringbuffer[uVar61 + uVar58] != ringbuffer[uVar30]))
              goto LAB_0030edb6;
              puVar37 = ringbuffer + uVar63;
              puVar48 = puVar54;
              puVar53 = puVar37;
              uVar30 = uVar60;
              if (7 < uVar60) {
                lVar47 = 0;
                lVar51 = 0;
LAB_0030ecbd:
                if (*(ulong *)(puVar54 + lVar47) == *(ulong *)(puVar37 + lVar47))
                goto code_r0x0030ecca;
                uVar63 = *(ulong *)(puVar37 + lVar47) ^ *(ulong *)(puVar54 + lVar47);
                uVar30 = 0;
                if (uVar63 != 0) {
                  for (; (uVar63 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar51;
                goto LAB_0030ed50;
              }
              goto LAB_0030ecfa;
            }
            goto LAB_0030edb6;
          }
          local_170 = 0x7e4;
          uVar29 = 0;
          local_190 = 0;
LAB_0030eddc:
          puVar3 = (ulong *)(ringbuffer + uVar58);
          uVar30 = *(long *)(ringbuffer + uVar58) * uVar15 >> 0x31;
          lVar47 = uVar30 << ((byte)uVar8 & 0x3f);
          uVar7 = *(ushort *)((long)puVar11 + uVar30 * 2);
          uVar36 = (ulong)uVar7;
          uVar52 = 0;
          if (uVar56 <= uVar36) {
            uVar52 = uVar36 - uVar56;
          }
          if (uVar52 < uVar36) {
            uVar35 = uVar35 - 5;
            piVar1 = (int *)((long)puVar3 + 4);
LAB_0030ee52:
            uVar36 = uVar36 - 1;
            uVar63 = uVar41 - puVar12[lVar47 + (ulong)((uint)uVar36 & uVar26)];
            if (uVar63 <= uVar59) {
              if (uVar61 + uVar58 <= ringbuffer_mask) {
                uVar44 = (ulong)(puVar12[lVar47 + (ulong)((uint)uVar36 & uVar26)] &
                                (uint)ringbuffer_mask);
                if (((ringbuffer_mask < uVar44 + uVar61) ||
                    (ringbuffer[uVar61 + uVar58] != ringbuffer[uVar44 + uVar61])) ||
                   (*(int *)(ringbuffer + uVar44) != (int)*(long *)(ringbuffer + uVar58)))
                goto LAB_0030ef7a;
                puVar48 = ringbuffer + uVar44 + 4;
                uVar44 = uVar35;
                puVar54 = puVar48;
                piVar57 = piVar1;
                if (7 < uVar35) {
                  lVar51 = 0;
LAB_0030eed0:
                  if (*(ulong *)((long)piVar1 + lVar51) == *(ulong *)(puVar48 + lVar51))
                  goto code_r0x0030eee2;
                  uVar39 = *(ulong *)(puVar48 + lVar51) ^ *(ulong *)((long)piVar1 + lVar51);
                  uVar44 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  lVar51 = (uVar44 >> 3 & 0x1fffffff) + lVar51;
                  goto LAB_0030ef44;
                }
                goto LAB_0030eef9;
              }
              goto LAB_0030ef7a;
            }
          }
LAB_0030ef88:
          puVar12[lVar47 + (ulong)(uVar26 & uVar7)] = (uint32_t)uVar41;
          *(ushort *)((long)puVar11 + uVar30 * 2) = uVar7 + 1;
          if (local_170 == 0x7e4) {
            pHVar16 = (hasher->privat)._H6.common_;
            uVar61 = pHVar16->dict_num_lookups;
            local_d8 = pHVar16->dict_num_matches;
            if (uVar61 >> 7 <= local_d8) {
              uVar35 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar54 = pBVar13->hash_table_lengths;
              iVar23 = 0;
              local_170 = 0x7e4;
              bVar43 = true;
LAB_0030f0d3:
              uVar61 = uVar61 + 1;
              pHVar16->dict_num_lookups = uVar61;
              bVar32 = puVar54[uVar35];
              uVar59 = (ulong)bVar32;
              if ((uVar59 != 0) && (uVar59 <= uVar60)) {
                pBVar17 = pBVar13->words;
                puVar38 = (ulong *)(pBVar17->data +
                                   (ulong)pBVar17->offsets_by_length[uVar59] +
                                   pBVar13->hash_table_words[uVar35] * uVar59);
                uVar58 = uVar59;
                puVar62 = puVar3;
                if (7 < bVar32) {
                  lVar47 = 0;
LAB_0030f128:
                  if (*puVar38 == *puVar62) goto code_r0x0030f133;
                  uVar52 = *puVar62 ^ *puVar38;
                  uVar58 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                    }
                  }
                  uVar58 = (uVar58 >> 3 & 0x1fffffff) - lVar47;
                  goto LAB_0030f196;
                }
                goto LAB_0030f15c;
              }
              goto LAB_0030f230;
            }
            iVar23 = 0;
            local_170 = 0x7e4;
          }
          else {
            iVar23 = 0;
          }
LAB_0030f004:
          if (local_170 < local_158 + 0xaf) {
            uVar41 = uVar49;
            uVar29 = local_88;
            local_190 = local_178;
            iVar23 = local_13c;
            sVar22 = local_138;
            local_c0 = uVar49 + sVar9;
            if (uVar6 <= uVar49 + sVar9) {
              local_c0 = uVar6;
            }
            break;
          }
          sVar22 = uVar31;
          if (iVar46 == 3) break;
          local_138 = local_138 + 1;
          iVar46 = iVar46 + 1;
          uVar61 = uVar49 + 9;
          local_130 = local_130 + -1;
          uVar35 = uVar60;
          uVar49 = uVar41;
          local_178 = local_190;
          local_158 = local_170;
          local_13c = iVar23;
          sVar22 = local_138;
          local_88 = uVar29;
        } while (uVar61 < uVar2);
        local_138 = sVar22;
        local_c0 = local_c0 + sVar10;
        if (local_c0 < uVar29) {
LAB_0030f432:
          uVar31 = uVar29 + 0xf;
LAB_0030f437:
          if ((uVar29 <= local_c0) && (uVar31 != 0)) {
            dist_cache[3] = dist_cache[2];
            uVar18 = *(undefined8 *)dist_cache;
            *(undefined8 *)(dist_cache + 1) = uVar18;
            iVar27 = (int)uVar29;
            *dist_cache = iVar27;
            uVar26 = (uint)(hasher->privat)._H35.hb.next_ix;
            if (4 < (int)uVar26) {
              dist_cache[4] = iVar27 + -1;
              dist_cache[5] = iVar27 + 1;
              dist_cache[6] = iVar27 + -2;
              dist_cache[7] = iVar27 + 2;
              dist_cache[8] = iVar27 + -3;
              dist_cache[9] = iVar27 + 3;
              if (10 < uVar26) {
                iVar27 = (int)uVar18;
                dist_cache[10] = iVar27 + -1;
                dist_cache[0xb] = iVar27 + 1;
                dist_cache[0xc] = iVar27 + -2;
                dist_cache[0xd] = iVar27 + 2;
                *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar27 + 3,iVar27 + -3);
              }
            }
          }
        }
        else {
          if (uVar29 != (long)*dist_cache) {
            uVar31 = 1;
            if (uVar29 != (long)dist_cache[1]) {
              uVar31 = (uVar29 + 3) - (long)*dist_cache;
              if (uVar31 < 7) {
                bVar32 = (byte)((int)uVar31 << 2);
                uVar26 = 0x9750468;
              }
              else {
                uVar31 = (uVar29 + 3) - (long)dist_cache[1];
                if (6 < uVar31) {
                  uVar31 = 2;
                  if ((uVar29 != (long)dist_cache[2]) && (uVar31 = 3, uVar29 != (long)dist_cache[3])
                     ) goto LAB_0030f432;
                  goto LAB_0030f437;
                }
                bVar32 = (byte)((int)uVar31 << 2);
                uVar26 = 0xfdb1ace;
              }
              uVar31 = (ulong)(uVar26 >> (bVar32 & 0x1f) & 0xf);
            }
            goto LAB_0030f437;
          }
          uVar31 = 0;
        }
        uVar26 = (uint)local_138;
        local_f0->insert_len_ = uVar26;
        local_f0->copy_len_ = iVar23 << 0x19 | (uint)local_190;
        uVar60 = (ulong)(params->dist).num_direct_distance_codes;
        uVar49 = uVar60 + 0x10;
        uVar24 = 0;
        if (uVar49 <= uVar31) {
          uVar40 = (params->dist).distance_postfix_bits;
          bVar32 = (byte)uVar40;
          uVar60 = ((4L << (bVar32 & 0x3f)) + (uVar31 - uVar60)) - 0x10;
          uVar50 = 0x1f;
          uVar25 = (uint)uVar60;
          if (uVar25 != 0) {
            for (; uVar25 >> uVar50 == 0; uVar50 = uVar50 - 1) {
            }
          }
          uVar50 = (uVar50 ^ 0xffffffe0) + 0x1f;
          uVar61 = (ulong)((uVar60 >> ((ulong)uVar50 & 0x3f) & 1) != 0);
          lVar47 = (ulong)uVar50 - (ulong)uVar40;
          uVar31 = (~(-1 << (bVar32 & 0x1f)) & uVar25) + uVar49 +
                   (uVar61 + lVar47 * 2 + 0xfffe << (bVar32 & 0x3f)) | lVar47 * 0x400;
          uVar24 = (uint32_t)(uVar60 - (uVar61 + 2 << ((byte)uVar50 & 0x3f)) >> (bVar32 & 0x3f));
        }
        local_f0->dist_prefix_ = (uint16_t)uVar31;
        local_f0->dist_extra_ = uVar24;
        if (5 < local_138) {
          if (local_138 < 0x82) {
            uVar26 = 0x1f;
            uVar40 = (uint)(local_138 - 2);
            if (uVar40 != 0) {
              for (; uVar40 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            uVar26 = (int)(local_138 - 2 >> ((char)(uVar26 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar26 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_138 < 0x842) {
            uVar40 = 0x1f;
            if (uVar26 - 0x42 != 0) {
              for (; uVar26 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar26 = (uVar40 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar26 = 0x15;
            if (0x1841 < local_138) {
              uVar26 = (uint)(ushort)(0x17 - (local_138 < 0x5842));
            }
          }
        }
        uVar40 = iVar23 + (uint)local_190;
        if (uVar40 < 10) {
          uVar50 = uVar40 - 2;
        }
        else if (uVar40 < 0x86) {
          uVar40 = uVar40 - 6;
          uVar50 = 0x1f;
          if (uVar40 != 0) {
            for (; uVar40 >> uVar50 == 0; uVar50 = uVar50 - 1) {
            }
          }
          uVar50 = (uVar40 >> ((char)(uVar50 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                   (uVar50 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar50 = 0x17;
          if (uVar40 < 0x846) {
            uVar50 = 0x1f;
            if (uVar40 - 0x46 != 0) {
              for (; uVar40 - 0x46 >> uVar50 == 0; uVar50 = uVar50 - 1) {
              }
            }
            uVar50 = (uVar50 ^ 0xffe0) + 0x2c;
          }
        }
        uVar7 = (ushort)uVar50;
        uVar45 = (uVar7 & 7) + ((ushort)uVar26 & 7) * 8;
        if ((((uVar31 & 0x3ff) == 0) && ((ushort)uVar26 < 8)) && (uVar7 < 0x10)) {
          if (7 < uVar7) {
            uVar45 = uVar45 + 0x40;
          }
        }
        else {
          iVar27 = ((uVar26 & 0xffff) >> 3) * 3 + ((uVar50 & 0xffff) >> 3);
          uVar45 = uVar45 + ((ushort)(0x520d40 >> ((char)iVar27 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar27 * 0x40 + 0x40;
        }
        local_f0->cmd_prefix_ = uVar45;
        *num_literals = *num_literals + local_138;
        position = local_190 + uVar41;
        uVar49 = sVar33;
        if (position < sVar33) {
          uVar49 = position;
        }
        uVar60 = uVar41 + 2;
        if (uVar29 < local_190 >> 2) {
          uVar31 = position + uVar29 * -4;
          if (uVar31 < uVar60) {
            uVar31 = uVar60;
          }
          uVar60 = uVar31;
          if (uVar49 < uVar31) {
            uVar60 = uVar49;
          }
        }
        uVar31 = uVar41 + lVar34 + local_190 * 2;
        local_f0 = local_f0 + 1;
        if (uVar60 < uVar49) {
          uVar15 = (hasher->privat)._H6.hash_mul_;
          uVar26 = (hasher->privat)._H6.block_mask_;
          uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar61 = *(long *)(ringbuffer + (uVar60 & ringbuffer_mask)) * uVar15 >> 0x31;
            uVar7 = *(ushort *)((long)puVar11 + uVar61 * 2);
            *(ushort *)((long)puVar11 + uVar61 * 2) = uVar7 + 1;
            puVar12[(uVar61 << ((byte)uVar8 & 0x3f)) + (ulong)(uVar26 & uVar7)] = (uint32_t)uVar60;
            uVar60 = uVar60 + 1;
          } while (uVar49 != uVar60);
          local_138 = 0;
        }
        else {
          local_138 = 0;
        }
      }
      uVar49 = position;
    } while (position + 8 < uVar2);
  }
  else {
    local_f0 = commands;
  }
  *last_insert_len = (local_138 + uVar2) - position;
  *num_commands = *num_commands + ((long)local_f0 - (long)commands >> 4);
  return;
code_r0x0030e59d:
  lVar47 = lVar47 + 8;
  lVar55 = uVar35 + lVar51;
  lVar51 = lVar51 + -8;
  if (lVar55 - 8U < 8) goto code_r0x0030e5b8;
  goto LAB_0030e590;
code_r0x0030e5b8:
  puVar48 = puVar37 + -lVar51;
  puVar53 = puVar54 + -lVar51;
  uVar52 = lVar51 + uVar35;
LAB_0030e5ce:
  if (uVar52 != 0) {
    uVar36 = 0;
    do {
      uVar30 = uVar36;
      if (puVar48[uVar36] != puVar53[uVar36]) break;
      uVar36 = uVar36 + 1;
      uVar30 = uVar52;
    } while (uVar52 != uVar36);
    puVar48 = puVar48 + uVar30;
  }
  uVar52 = (long)puVar48 - (long)puVar37;
LAB_0030e617:
  if (((2 < uVar52) || ((uVar58 < 2 && (uVar52 == 2)))) &&
     (uVar36 = uVar52 * 0x87 + 0x78f, local_158 < uVar36)) {
    if (uVar58 != 0) {
      uVar36 = uVar36 - ((0x1ca10U >> ((byte)uVar58 & 0xe) & 0xe) + 0x27);
    }
    if (local_158 < uVar36) {
      local_88 = uVar29;
      uVar59 = uVar52;
      local_178 = uVar52;
      local_158 = uVar36;
    }
  }
LAB_0030e674:
  uVar58 = uVar58 + 1;
  if (uVar58 == uVar56) goto LAB_0030e69b;
  goto LAB_0030e521;
code_r0x0030e7c6:
  uVar63 = uVar63 - 8;
  lVar51 = lVar51 + 8;
  if (uVar63 < 8) goto code_r0x0030e7d4;
  goto LAB_0030e7b4;
code_r0x0030e7d4:
  puVar54 = puVar48 + lVar51;
  piVar57 = (int *)(lVar51 + (long)piVar1);
LAB_0030e7e2:
  if (uVar63 != 0) {
    uVar44 = 0;
    do {
      uVar39 = uVar44;
      if (puVar54[uVar44] != *(uint8_t *)((long)piVar57 + uVar44)) break;
      uVar44 = uVar44 + 1;
      uVar39 = uVar63;
    } while (uVar63 != uVar44);
    puVar54 = puVar54 + uVar39;
  }
  lVar51 = (long)puVar54 - (long)puVar48;
LAB_0030e835:
  uVar63 = lVar51 + 4;
  iVar27 = 0x1f;
  if ((uint)uVar30 != 0) {
    for (; (uint)uVar30 >> iVar27 == 0; iVar27 = iVar27 + -1) {
    }
  }
  uVar44 = (ulong)(iVar27 * -0x1e + 0x780) + uVar63 * 0x87;
  if (local_158 < uVar44) {
    local_88 = uVar30;
    uVar59 = uVar63;
    local_178 = uVar63;
    local_158 = uVar44;
  }
LAB_0030e866:
  if (uVar29 <= uVar58) goto LAB_0030e87b;
  goto LAB_0030e735;
code_r0x0030e994:
  puVar38 = puVar38 + 1;
  puVar42 = puVar42 + 1;
  lVar51 = uVar59 + lVar47;
  lVar47 = lVar47 + -8;
  if (lVar51 - 8U < 8) goto code_r0x0030e9ae;
  goto LAB_0030e989;
code_r0x0030e9ae:
  puVar62 = puVar42;
  uVar58 = lVar47 + uVar59;
  if (lVar47 + uVar59 != 0) {
LAB_0030e9bd:
    puVar42 = (ulong *)((long)puVar62 + uVar58);
    uVar29 = 0;
    do {
      if (*(char *)((long)puVar62 + uVar29) != *(char *)((long)puVar38 + uVar29)) {
        puVar42 = (ulong *)((long)puVar62 + uVar29);
        break;
      }
      uVar29 = uVar29 + 1;
    } while (uVar58 != uVar29);
  }
  uVar58 = (long)puVar42 - (long)puVar3;
LAB_0030e9f2:
  if (((uVar58 != 0) && (uVar59 < pBVar13->cutoffTransformsCount + uVar58)) &&
     (uVar59 = (ulong)pBVar13->hash_table_words[uVar41] + uVar61 + lVar28 +
               ((ulong)((uint)(pBVar13->cutoffTransforms >>
                              ((char)(uVar59 - uVar58) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar59 - uVar58) * 4 << (pBVar17->size_bits_by_length[uVar59] & 0x3f)),
     uVar59 <= uVar14)) {
    iVar27 = 0x1f;
    if ((uint)uVar59 != 0) {
      for (; (uint)uVar59 >> iVar27 == 0; iVar27 = iVar27 + -1) {
      }
    }
    uVar29 = (uVar58 * 0x87 - (ulong)(uint)(iVar27 * 0x1e)) + 0x780;
    if (local_158 <= uVar29) {
      local_13c = (uint)bVar32 - (int)uVar58;
      local_130 = local_130 + 1;
      pHVar16->dict_num_matches = local_130;
      local_158 = uVar29;
      local_178 = uVar58;
      local_88 = uVar59;
    }
  }
LAB_0030e93a:
  uVar41 = uVar41 + 1;
  bVar20 = !bVar43;
  bVar43 = false;
  if (bVar20) goto LAB_0030eae8;
  goto LAB_0030e919;
code_r0x0030ecca:
  lVar47 = lVar47 + 8;
  lVar55 = local_130 + lVar51;
  lVar51 = lVar51 + -8;
  if (lVar55 - 8U < 8) goto code_r0x0030ece4;
  goto LAB_0030ecbd;
code_r0x0030ece4:
  puVar53 = puVar37 + -lVar51;
  puVar48 = puVar54 + -lVar51;
  uVar30 = lVar51 + local_130;
LAB_0030ecfa:
  if (uVar30 != 0) {
    uVar63 = 0;
    do {
      uVar44 = uVar63;
      if (puVar53[uVar63] != puVar48[uVar63]) break;
      uVar63 = uVar63 + 1;
      uVar44 = uVar30;
    } while (uVar30 != uVar63);
    puVar53 = puVar53 + uVar44;
  }
  uVar30 = (long)puVar53 - (long)puVar37;
LAB_0030ed50:
  if (((2 < uVar30) || ((uVar52 < 2 && (uVar30 == 2)))) &&
     (uVar63 = uVar30 * 0x87 + 0x78f, local_170 < uVar63)) {
    if (uVar52 != 0) {
      uVar63 = uVar63 - ((0x1ca10U >> ((byte)uVar52 & 0xe) & 0xe) + 0x27);
    }
    if (local_170 < uVar63) {
      uVar29 = uVar36;
      uVar61 = uVar30;
      local_190 = uVar30;
      local_170 = uVar63;
    }
  }
LAB_0030edb6:
  uVar52 = uVar52 + 1;
  if (uVar52 == (long)iVar27) goto LAB_0030eddc;
  goto LAB_0030ec4b;
code_r0x0030eee2:
  uVar44 = uVar44 - 8;
  lVar51 = lVar51 + 8;
  if (uVar44 < 8) goto code_r0x0030eef0;
  goto LAB_0030eed0;
code_r0x0030eef0:
  puVar54 = puVar48 + lVar51;
  piVar57 = (int *)(lVar51 + (long)piVar1);
LAB_0030eef9:
  if (uVar44 != 0) {
    uVar39 = 0;
    do {
      uVar21 = uVar39;
      if (puVar54[uVar39] != *(uint8_t *)((long)piVar57 + uVar39)) break;
      uVar39 = uVar39 + 1;
      uVar21 = uVar44;
    } while (uVar44 != uVar39);
    puVar54 = puVar54 + uVar21;
  }
  lVar51 = (long)puVar54 - (long)puVar48;
LAB_0030ef44:
  uVar44 = lVar51 + 4;
  iVar23 = 0x1f;
  if ((uint)uVar63 != 0) {
    for (; (uint)uVar63 >> iVar23 == 0; iVar23 = iVar23 + -1) {
    }
  }
  uVar39 = (ulong)(iVar23 * -0x1e + 0x780) + uVar44 * 0x87;
  if (local_170 < uVar39) {
    uVar29 = uVar63;
    uVar61 = uVar44;
    local_190 = uVar44;
    local_170 = uVar39;
  }
LAB_0030ef7a:
  if (uVar36 <= uVar52) goto LAB_0030ef88;
  goto LAB_0030ee52;
code_r0x0030f133:
  puVar38 = puVar38 + 1;
  puVar62 = puVar62 + 1;
  lVar51 = uVar59 + lVar47;
  lVar47 = lVar47 + -8;
  if (lVar51 - 8U < 8) goto code_r0x0030f14d;
  goto LAB_0030f128;
code_r0x0030f14d:
  uVar58 = lVar47 + uVar59;
  if (lVar47 + uVar59 != 0) {
LAB_0030f15c:
    uVar52 = 0;
    do {
      uVar36 = uVar52;
      if (*(char *)((long)puVar62 + uVar52) != *(char *)((long)puVar38 + uVar52)) break;
      uVar52 = uVar52 + 1;
      uVar36 = uVar58;
    } while (uVar58 != uVar52);
    puVar62 = (ulong *)((long)puVar62 + uVar36);
  }
  uVar58 = (long)puVar62 - (long)puVar3;
LAB_0030f196:
  if (((uVar58 != 0) && (uVar59 < pBVar13->cutoffTransformsCount + uVar58)) &&
     (uVar59 = (ulong)pBVar13->hash_table_words[uVar35] + lVar28 + local_c0 +
               ((ulong)((uint)(pBVar13->cutoffTransforms >>
                              ((char)(uVar59 - uVar58) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar59 - uVar58) * 4 << (pBVar17->size_bits_by_length[uVar59] & 0x3f)),
     uVar59 <= uVar14)) {
    iVar19 = 0x1f;
    if ((uint)uVar59 != 0) {
      for (; (uint)uVar59 >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    uVar52 = (uVar58 * 0x87 - (ulong)(uint)(iVar19 * 0x1e)) + 0x780;
    if (local_170 <= uVar52) {
      iVar23 = (uint)bVar32 - (int)uVar58;
      local_d8 = local_d8 + 1;
      pHVar16->dict_num_matches = local_d8;
      local_170 = uVar52;
      uVar29 = uVar59;
      local_190 = uVar58;
    }
  }
LAB_0030f230:
  uVar35 = uVar35 + 1;
  bVar20 = !bVar43;
  bVar43 = false;
  if (bVar20) goto LAB_0030f004;
  goto LAB_0030f0d3;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}